

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

int Mvc_CoverCountCubePairDiffs(Mvc_Cover_t *pCover,uchar *pDiffs)

{
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pMVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  Mvc_Cube_t *pMVar5;
  uchar uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  Mvc_CubeWord_t *pMVar10;
  bool bVar11;
  
  pCube = Mvc_CubeAlloc(pCover);
  pMVar1 = (pCover->lCubes).pHead;
  if (pMVar1 != (Mvc_Cube_t *)0x0) {
    lVar2 = (long)(int)(((int)((ulong)(long)pCover->nBits >> 3) + 1) -
                       (uint)((pCover->nBits & 7U) == 0));
    lVar4 = 0;
    do {
      pMVar5 = pMVar1->pNext;
      if (pMVar5 != (Mvc_Cube_t *)0x0) {
        lVar4 = (long)(int)lVar4;
        do {
          uVar3 = *(uint *)&pMVar1->field_0x8 & 0xffffff;
          if (uVar3 == 0) {
            pCube->pData[0] = pMVar5->pData[0] ^ pMVar1->pData[0];
          }
          else if (uVar3 == 1) {
            pCube->pData[0] = pMVar5->pData[0] ^ pMVar1->pData[0];
            *(uint *)&pCube->field_0x14 =
                 *(uint *)&pMVar5->field_0x14 ^ *(uint *)&pMVar1->field_0x14;
          }
          else {
            lVar8 = (ulong)(*(uint *)&pMVar1->field_0x8 & 0xffffff) + 4;
            do {
              pCube->pData[lVar8 + -4] = pMVar5->pData[lVar8 + -4] ^ pMVar1->pData[lVar8 + -4];
              lVar9 = lVar8 + -4;
              bVar11 = lVar8 != 4;
              lVar8 = lVar8 + -1;
            } while (bVar11 && -1 < lVar9);
          }
          iVar7 = 0;
          uVar6 = '\0';
          pMVar10 = pCube->pData;
          if (0 < lVar2) {
            do {
              iVar7 = iVar7 + bit_count[(byte)*pMVar10];
              uVar6 = (uchar)iVar7;
              pMVar10 = (Mvc_CubeWord_t *)((long)pMVar10 + 1);
            } while (pMVar10 < (byte *)((long)pCube->pData + lVar2));
          }
          pDiffs[lVar4] = uVar6;
          lVar4 = lVar4 + 1;
          pMVar5 = pMVar5->pNext;
        } while (pMVar5 != (Mvc_Cube_t *)0x0);
      }
      pMVar1 = pMVar1->pNext;
    } while (pMVar1 != (Mvc_Cube_t *)0x0);
  }
  Mvc_CubeFree(pCover,pCube);
  return 1;
}

Assistant:

int Mvc_CoverCountCubePairDiffs( Mvc_Cover_t * pCover, unsigned char pDiffs[] )
{
    Mvc_Cube_t * pCube1;
    Mvc_Cube_t * pCube2;
    Mvc_Cube_t * pMask;
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nBytes, nOnes;
    int nCubePairs;

    // allocate a temporary mask
    pMask = Mvc_CubeAlloc( pCover );
    // get the number of unsigned chars in the cube's bit strings
    nBytes = pCover->nBits / (8 * sizeof(unsigned char)) + (int)(pCover->nBits % (8 * sizeof(unsigned char)) > 0);
    // iterate through the cubes
    nCubePairs = 0;
    Mvc_CoverForEachCube( pCover, pCube1 )
    {
        Mvc_CoverForEachCubeStart( Mvc_CubeReadNext(pCube1), pCube2 )
        {
            // find the bit-wise exor of cubes
            Mvc_CubeBitExor( pMask, pCube1, pCube2 );
            // set the starting and stopping positions
            pByteStart = (unsigned char *)pMask->pData;
            pByteStop  = pByteStart + nBytes;
            // clean the counter of ones
            nOnes = 0;
            // iterate through the positions
            for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
                nOnes += bit_count[*pByte];
            // set the nOnes
            pDiffs[nCubePairs++] = nOnes;
        }
    }
    // deallocate the mask
    Mvc_CubeFree( pCover, pMask );
    return 1;
}